

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

void __thiscall
helics::Input::Input
          (Input *this,InterfaceVisibility locality,ValueFederate *valueFed,string_view key,
          string_view defaultType,string_view units)

{
  string_view type;
  string_view name;
  string_view units_00;
  string_view name_00;
  string_view units_01;
  size_t in_RCX;
  int in_ESI;
  undefined8 *in_RDI;
  char *in_R8;
  undefined1 in_stack_00000008 [16];
  Input *in_stack_00000018;
  ValueFederate *in_stack_00000020;
  RegistrationFailure *anon_var_0;
  double *in_stack_fffffffffffffec8;
  Interface *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  ValueFederate *this_00;
  undefined8 *puVar1;
  char *pcVar2;
  undefined8 *puVar3;
  char *pcVar4;
  undefined8 *puVar5;
  char *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  
  Interface::Interface(in_stack_fffffffffffffed0);
  *in_RDI = &PTR__Input_0092b6a0;
  in_RDI[7] = 0;
  *(undefined4 *)(in_RDI + 8) = 0xffffffff;
  in_RDI[9] = 0;
  *(undefined4 *)(in_RDI + 10) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x54) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0xb) = 0;
  *(undefined1 *)((long)in_RDI + 0x59) = 0;
  *(undefined1 *)((long)in_RDI + 0x5a) = 0;
  *(undefined1 *)((long)in_RDI + 0x5b) = 0;
  *(undefined1 *)((long)in_RDI + 0x5c) = 0;
  *(undefined2 *)((long)in_RDI + 0x5e) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  in_RDI[0xd] = 0;
  this_00 = (ValueFederate *)(in_RDI + 0xe);
  std::
  variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
  ::variant<double_const&,void,void,double,void>
            ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
              *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  puVar1 = in_RDI + 0x14;
  std::shared_ptr<units::precise_unit>::shared_ptr((shared_ptr<units::precise_unit> *)0x366ae6);
  pcVar2 = (char *)(in_RDI + 0x16);
  std::shared_ptr<units::precise_unit>::shared_ptr((shared_ptr<units::precise_unit> *)0x366afc);
  puVar3 = in_RDI + 0x18;
  std::
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ::vector((vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
            *)0x366b12);
  pcVar4 = (char *)(in_RDI + 0x1b);
  std::__cxx11::string::string(in_stack_fffffffffffffee0);
  in_RDI[0x1f] = 0xbff0000000000000;
  in_RDI[0x20] = 0;
  puVar5 = in_RDI + 0x21;
  std::
  variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
  ::variant((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
             *)0x366b59);
  if (in_ESI == 1) {
    name._M_str = pcVar4;
    name._M_len = (size_t)puVar3;
    type._M_str = pcVar2;
    type._M_len = (size_t)puVar1;
    units_00._M_str = in_stack_ffffffffffffff48;
    units_00._M_len = (size_t)puVar5;
    helics::ValueFederate::registerGlobalInput(this_00,name,type,units_00);
    operator=((Input *)in_stack_00000020,in_stack_00000018);
  }
  else {
    name_00._M_str = in_R8;
    name_00._M_len = in_RCX;
    units_01._M_str = in_stack_ffffffffffffffa8;
    units_01._M_len = in_stack_ffffffffffffffa0;
    helics::ValueFederate::registerInput
              (in_stack_00000020,name_00,(string_view)in_stack_00000008,units_01);
    operator=((Input *)in_stack_00000020,in_stack_00000018);
  }
  return;
}

Assistant:

Input::Input(InterfaceVisibility locality,
             ValueFederate* valueFed,
             std::string_view key,
             std::string_view defaultType,
             std::string_view units)
{
    try {
        if (locality == InterfaceVisibility::GLOBAL) {
            operator=(valueFed->registerGlobalInput(key, defaultType, units));
        } else {
            operator=(valueFed->registerInput(key, defaultType, units));
        }
    }
    catch (const RegistrationFailure&) {
        operator=(valueFed->getInput(key));
        if (!isValid()) {
            throw;
        }
    }
}